

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_ThrowTypeErrorReadOnly(JSContext *ctx,int flags,JSAtom atom)

{
  char *pcVar1;
  JSStackFrame *in_RCX;
  char buf [64];
  char acStack_48 [64];
  
  if (((uint)flags >> 0xe & 1) == 0) {
    if (-1 < (short)flags) {
      return 0;
    }
    in_RCX = ctx->rt->current_stack_frame;
    if (in_RCX == (JSStackFrame *)0x0) {
      return 0;
    }
    if ((in_RCX->js_mode & 1) == 0) {
      return 0;
    }
  }
  pcVar1 = JS_AtomGetStrRT(ctx->rt,acStack_48,atom,(JSAtom)in_RCX);
  JS_ThrowTypeError(ctx,"\'%s\' is read-only",pcVar1);
  return -1;
}

Assistant:

static int JS_ThrowTypeErrorReadOnly(JSContext *ctx, int flags, JSAtom atom)
{
    if ((flags & JS_PROP_THROW) ||
        ((flags & JS_PROP_THROW_STRICT) && is_strict_mode(ctx))) {
        JS_ThrowTypeErrorAtom(ctx, "'%s' is read-only", atom);
        return -1;
    } else {
        return FALSE;
    }
}